

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MessageOptions::MergeFrom(MessageOptions *this,Message *from)

{
  MessageOptions *pMVar1;
  MessageOptions *in_RDI;
  MessageOptions *unaff_retaddr;
  MessageOptions *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pMVar1 = DynamicCastToGenerated<google::protobuf::MessageOptions>(&in_RDI->super_Message);
  if (pMVar1 == (MessageOptions *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void MessageOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.MessageOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const MessageOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<MessageOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.MessageOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.MessageOptions)
    MergeFrom(*source);
  }
}